

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void cfd::core::SetKeyPathMap
               (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list,
               wally_map *map_obj)

{
  pointer pKVar1;
  bool bVar2;
  size_t sVar3;
  CfdException *this;
  allocator_type *this_00;
  pointer this_01;
  int ret;
  wally_map *local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  undefined1 local_b0 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fingerprint;
  Pubkey local_78;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ByteData fp;
  
  this_01 = (key_list->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pKVar1 = (key_list->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_f0 = map_obj;
  do {
    if (this_01 == pKVar1) {
      return;
    }
    KeyData::GetPubkey((Pubkey *)&fingerprint,this_01);
    Pubkey::GetData((ByteData *)local_b0,(Pubkey *)&fingerprint);
    ByteData::GetBytes(&key_vec,(ByteData *)local_b0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint,4,
               (allocator_type *)local_b0);
    KeyData::GetFingerprint(&fp,this_01);
    KeyData::GetChildNumArray(&path,this_01);
    bVar2 = ByteData::IsEmpty(&fp);
    if ((bVar2) &&
       (path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      KeyData::GetPubkey(&local_78,this_01);
      Pubkey::GetFingerprint((ByteData *)&local_60,&local_78,4);
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,
                         (ByteData *)&local_60);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint,
                 (allocator_type *)local_b0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
      this_00 = (allocator_type *)&local_78;
LAB_002d99e6:
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    }
    else {
      sVar3 = ByteData::GetDataSize(&fp);
      if (3 < sVar3) {
        ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,&fp);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint,
                   (allocator_type *)local_b0);
        this_00 = (allocator_type *)local_b0;
        goto LAB_002d99e6;
      }
    }
    ret = wally_map_add_keypath_item
                    (local_f0,key_vec.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                     (long)key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                     fingerprint.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,4,
                     path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2);
    if (ret != 0) {
      wally_map_free(local_f0);
      local_b0._0_8_ = "cfdcore_psbt.cpp";
      local_b0._8_4_ = 0x44;
      local_b0._16_8_ = "SetKeyPathMap";
      logger::warn<int&>((CfdSourceLocation *)local_b0,"wally_map_add_keypath_item NG[{}]",&ret);
      this = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_b0,"psbt add keypath error.",(allocator *)&local_60);
      CfdException::CfdException(this,kCfdMemoryFullError,(string *)local_b0);
      __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fp);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

static void SetKeyPathMap(
    const std::vector<KeyData> &key_list, struct wally_map *map_obj) {
  int ret;
  for (auto &key : key_list) {
    auto key_vec = key.GetPubkey().GetData().GetBytes();
    std::vector<uint8_t> fingerprint(4);
    auto fp = key.GetFingerprint();
    auto path = key.GetChildNumArray();
    if (fp.IsEmpty() && path.empty()) {
      fingerprint = key.GetPubkey().GetFingerprint().GetBytes();
    } else if (fp.GetDataSize() >= 4) {
      fingerprint = fp.GetBytes();
    }

    ret = wally_map_add_keypath_item(
        map_obj, key_vec.data(), key_vec.size(), fingerprint.data(), 4,
        path.data(), path.size());
    if (ret != WALLY_OK) {
      wally_map_free(map_obj);
      warn(CFD_LOG_SOURCE, "wally_map_add_keypath_item NG[{}]", ret);
      throw CfdException(kCfdMemoryFullError, "psbt add keypath error.");
    }
  }
}